

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
          (void *this,byte *param_2)

{
  undefined2 uVar1;
  
  uVar1 = *(undefined2 *)param_2;
  *param_2 = *this & 0xf;
  param_2[1] = *(byte *)((long)this + 1);
  *(undefined8 *)(param_2 + 8) = *(undefined8 *)((long)this + 8);
  *(undefined2 *)this = uVar1;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }